

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  bool bVar2;
  rpchook_t *prVar3;
  int *piVar4;
  uint *puVar5;
  int _set_errno;
  ssize_t readret;
  int pollret;
  pollfd pf;
  int timeout;
  ssize_t ret;
  rpchook_t *lp;
  size_t nbyte_local;
  void *buf_local;
  ssize_t sStack_10;
  int fd_local;
  
  if (g_sys_read_func == (read_pfn_t)0x0) {
    g_sys_read_func = (read_pfn_t)dlsym(0xffffffffffffffff);
  }
  bVar2 = co_is_enable_sys_hook();
  if (bVar2) {
    prVar3 = get_by_fd(__fd);
    if ((prVar3 == (rpchook_t *)0x0) || ((prVar3->user_flag & 0x800U) != 0)) {
      sStack_10 = (*g_sys_read_func)(__fd,__buf,__nbytes);
    }
    else {
      pf.fd = (int)(prVar3->read_timeout).tv_sec * 1000 +
              (int)((prVar3->read_timeout).tv_usec / 1000);
      memset((void *)((long)&readret + 4),0,8);
      pollret._0_2_ = 0x19;
      readret._4_4_ = __fd;
      readret._0_4_ = poll((pollfd *)((long)&readret + 4),1,pf.fd);
      sStack_10 = (*g_sys_read_func)(__fd,__buf,__nbytes);
      if (sStack_10 < 0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        puVar5 = (uint *)__errno_location();
        co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",(ulong)(uint)__fd,
                   sStack_10,(ulong)*puVar5,(ulong)(uint)readret,(ulong)(uint)pf.fd);
        piVar4 = __errno_location();
        *piVar4 = iVar1;
        piVar4 = __errno_location();
        if (*piVar4 == 0xb) {
          piVar4 = __errno_location();
          *piVar4 = 0x7c5;
        }
      }
    }
  }
  else {
    sStack_10 = (*g_sys_read_func)(__fd,__buf,__nbytes);
  }
  return sStack_10;
}

Assistant:

ssize_t read( int fd, void *buf, size_t nbyte )
{
	HOOK_SYS_FUNC( read );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_read_func( fd,buf,nbyte );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) ) 
	{
		ssize_t ret = g_sys_read_func( fd,buf,nbyte );
		return ret;
	}
	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );

	struct pollfd pf = { 0 };
	pf.fd = fd;
	pf.events = ( POLLIN | POLLERR | POLLHUP );

	int pollret = poll( &pf,1,timeout );/* blocks and continues if there is some data on fd or timeout has occured*/

	ssize_t readret = g_sys_read_func( fd,(char*)buf ,nbyte );

	if( readret < 0 ){
		int _set_errno = errno;
		co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",
					fd,readret,errno,pollret,timeout);

		errno = _set_errno;
		if(errno == EAGAIN){
			errno = LIBCO_POLL_TIMEOUT;
		}

	}

	return readret;
	
}